

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall re2::NFA::Decref(NFA *this,Thread *t)

{
  int iVar1;
  
  if ((t != (Thread *)0x0) && (iVar1 = (t->field_0).ref, (t->field_0).ref = iVar1 + -1, iVar1 < 2))
  {
    t->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
    this->free_threads_ = t;
  }
  return;
}

Assistant:

void NFA::Decref(Thread* t) {
  if (t == NULL)
    return;
  t->ref--;
  if (t->ref > 0)
    return;
  DCHECK_EQ(t->ref, 0);
  t->next = free_threads_;
  free_threads_ = t;
}